

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O1

JSAMPARRAY
access_virt_sarray(j_common_ptr cinfo,jvirt_sarray_ptr ptr,JDIMENSION start_row,JDIMENSION num_rows,
                  boolean writable)

{
  uint uVar1;
  jpeg_error_mgr *pjVar2;
  JDIMENSION JVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar6 = num_rows + start_row;
  if (((ptr->rows_in_array < uVar6) || (ptr->maxaccess < num_rows)) ||
     (ptr->mem_buffer == (JSAMPARRAY)0x0)) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x17;
    (*pjVar2->error_exit)(cinfo);
  }
  if ((start_row < ptr->cur_start_row) || (ptr->cur_start_row + ptr->rows_in_mem < uVar6)) {
    if (ptr->b_s_open == 0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x47;
      (*pjVar2->error_exit)(cinfo);
    }
    if (ptr->dirty != 0) {
      do_sarray_io(cinfo,ptr,1);
      ptr->dirty = 0;
    }
    JVar3 = start_row;
    if (start_row <= ptr->cur_start_row) {
      lVar5 = (ulong)uVar6 - (ulong)ptr->rows_in_mem;
      JVar3 = 0;
      if (0 < lVar5) {
        JVar3 = (JDIMENSION)lVar5;
      }
    }
    ptr->cur_start_row = JVar3;
    do_sarray_io(cinfo,ptr,0);
  }
  uVar4 = ptr->first_undef_row;
  if (uVar4 < uVar6) {
    if ((uVar4 < start_row) && (uVar4 = start_row, writable != 0)) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x17;
      (*pjVar2->error_exit)(cinfo);
    }
    if (writable != 0) {
      ptr->first_undef_row = uVar6;
    }
    if (ptr->pre_zero == 0) {
      if (writable == 0) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x17;
        (*pjVar2->error_exit)(cinfo);
      }
    }
    else {
      uVar4 = uVar4 - ptr->cur_start_row;
      uVar6 = uVar6 - ptr->cur_start_row;
      if (uVar4 < uVar6) {
        uVar1 = ptr->samplesperrow;
        uVar7 = (ulong)uVar4;
        do {
          memset(ptr->mem_buffer[uVar7],0,(ulong)uVar1);
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
    }
  }
  if (writable != 0) {
    ptr->dirty = 1;
  }
  return ptr->mem_buffer + (start_row - ptr->cur_start_row);
}

Assistant:

METHODDEF(JSAMPARRAY)
access_virt_sarray (j_common_ptr cinfo, jvirt_sarray_ptr ptr,
		    JDIMENSION start_row, JDIMENSION num_rows,
		    boolean writable)
/* Access the part of a virtual sample array starting at start_row */
/* and extending for num_rows rows.  writable is true if  */
/* caller intends to modify the accessed area. */
{
  JDIMENSION end_row = start_row + num_rows;
  JDIMENSION undef_row;

  /* debugging check */
  if (end_row > ptr->rows_in_array || num_rows > ptr->maxaccess ||
      ptr->mem_buffer == NULL)
    ERREXIT(cinfo, JERR_BAD_VIRTUAL_ACCESS);

  /* Make the desired part of the virtual array accessible */
  if (start_row < ptr->cur_start_row ||
      end_row > ptr->cur_start_row+ptr->rows_in_mem) {
    if (! ptr->b_s_open)
      ERREXIT(cinfo, JERR_VIRTUAL_BUG);
    /* Flush old buffer contents if necessary */
    if (ptr->dirty) {
      do_sarray_io(cinfo, ptr, TRUE);
      ptr->dirty = FALSE;
    }
    /* Decide what part of virtual array to access.
     * Algorithm: if target address > current window, assume forward scan,
     * load starting at target address.  If target address < current window,
     * assume backward scan, load so that target area is top of window.
     * Note that when switching from forward write to forward read, will have
     * start_row = 0, so the limiting case applies and we load from 0 anyway.
     */
    if (start_row > ptr->cur_start_row) {
      ptr->cur_start_row = start_row;
    } else {
      /* use long arithmetic here to avoid overflow & unsigned problems */
      long ltemp;

      ltemp = (long) end_row - (long) ptr->rows_in_mem;
      if (ltemp < 0)
	ltemp = 0;		/* don't fall off front end of file */
      ptr->cur_start_row = (JDIMENSION) ltemp;
    }
    /* Read in the selected part of the array.
     * During the initial write pass, we will do no actual read
     * because the selected part is all undefined.
     */
    do_sarray_io(cinfo, ptr, FALSE);
  }
  /* Ensure the accessed part of the array is defined; prezero if needed.
   * To improve locality of access, we only prezero the part of the array
   * that the caller is about to access, not the entire in-memory array.
   */
  if (ptr->first_undef_row < end_row) {
    if (ptr->first_undef_row < start_row) {
      if (writable)		/* writer skipped over a section of array */
	ERREXIT(cinfo, JERR_BAD_VIRTUAL_ACCESS);
      undef_row = start_row;	/* but reader is allowed to read ahead */
    } else {
      undef_row = ptr->first_undef_row;
    }
    if (writable)
      ptr->first_undef_row = end_row;
    if (ptr->pre_zero) {
      size_t bytesperrow = (size_t) ptr->samplesperrow * SIZEOF(JSAMPLE);
      undef_row -= ptr->cur_start_row; /* make indexes relative to buffer */
      end_row -= ptr->cur_start_row;
      while (undef_row < end_row) {
	FMEMZERO((void FAR *) ptr->mem_buffer[undef_row], bytesperrow);
	undef_row++;
      }
    } else {
      if (! writable)		/* reader looking at undefined data */
	ERREXIT(cinfo, JERR_BAD_VIRTUAL_ACCESS);
    }
  }
  /* Flag the buffer dirty if caller will write in it */
  if (writable)
    ptr->dirty = TRUE;
  /* Return address of proper part of the buffer */
  return ptr->mem_buffer + (start_row - ptr->cur_start_row);
}